

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitStructGet(OptimizeInstructions *this,StructGet *curr)

{
  bool bVar1;
  byte local_21;
  HeapType local_20;
  StructGet *local_18;
  StructGet *curr_local;
  OptimizeInstructions *this_local;
  
  local_18 = curr;
  curr_local = (StructGet *)this;
  skipNonNullCast(this,&curr->ref,(Expression *)curr);
  trapOnNull(this,(Expression *)local_18,&local_18->ref);
  local_21 = 0;
  if (local_18->order == AcqRel) {
    bVar1 = wasm::Type::isRef(&local_18->ref->type);
    local_21 = 0;
    if (bVar1) {
      local_20 = wasm::Type::getHeapType(&local_18->ref->type);
      bVar1 = HeapType::isShared(&local_20);
      local_21 = bVar1 ^ 0xff;
    }
  }
  if ((local_21 & 1) != 0) {
    local_18->order = Unordered;
  }
  return;
}

Assistant:

void visitStructGet(StructGet* curr) {
    skipNonNullCast(curr->ref, curr);
    trapOnNull(curr, curr->ref);
    // Relax acquire loads of unshared fields to unordered because they cannot
    // synchronize with other threads.
    if (curr->order == MemoryOrder::AcqRel && curr->ref->type.isRef() &&
        !curr->ref->type.getHeapType().isShared()) {
      curr->order = MemoryOrder::Unordered;
    }
  }